

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O1

void Map_ManPrintStatsToFile(char *pName,float Area,float Delay,abctime Time)

{
  FILE *__stream;
  
  __stream = fopen("map_stats.txt","a+");
  fprintf(__stream,"%s ",pName);
  fprintf(__stream,"%4.2f ",(double)Area);
  fprintf(__stream,"%4.2f ",(double)Delay);
  fprintf(__stream,"%4.2f\n",(double)((float)Time / 1e+06));
  fclose(__stream);
  return;
}

Assistant:

void Map_ManPrintStatsToFile( char * pName, float Area, float Delay, abctime Time )
{
    FILE * pTable;
    pTable = fopen( "map_stats.txt", "a+" );
    fprintf( pTable, "%s ", pName );
    fprintf( pTable, "%4.2f ", Area );
    fprintf( pTable, "%4.2f ", Delay );
    fprintf( pTable, "%4.2f\n", (float)(Time)/(float)(CLOCKS_PER_SEC) );
    fclose( pTable );
}